

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O1

void __thiscall
ValidationSignals::ActiveTipChange(ValidationSignals *this,CBlockIndex *new_tip,bool is_ibd)

{
  _List_node_base *p_Var1;
  uint256 *puVar2;
  _Head_base<0UL,_ValidationSignalsImpl_*,_false> _Var3;
  _List_node_base *p_Var4;
  base_blob<256U> *pbVar5;
  bool bVar6;
  Logger *this_00;
  iterator __ret;
  _List_node_base *this_01;
  iterator __position;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  reverse_lock local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = LogInstance();
  bVar6 = BCLog::Logger::WillLogCategoryLevel(this_00,VALIDATION,Debug);
  if (bVar6) {
    puVar2 = new_tip->phashBlock;
    if (puVar2 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    lock.super_unique_lock._M_device =
         *(mutex_type **)(puVar2->super_base_blob<256U>).m_data._M_elems;
    pbVar5 = &puVar2->super_base_blob<256U>;
    lock.super_unique_lock._M_owns = (bool)(pbVar5->m_data)._M_elems[8];
    lock.super_unique_lock._9_1_ = (pbVar5->m_data)._M_elems[9];
    lock.super_unique_lock._10_1_ = (pbVar5->m_data)._M_elems[10];
    lock.super_unique_lock._11_1_ = (pbVar5->m_data)._M_elems[0xb];
    lock.super_unique_lock._12_1_ = (pbVar5->m_data)._M_elems[0xc];
    lock.super_unique_lock._13_1_ = (pbVar5->m_data)._M_elems[0xd];
    lock.super_unique_lock._14_1_ = (pbVar5->m_data)._M_elems[0xe];
    lock.super_unique_lock._15_1_ = (pbVar5->m_data)._M_elems[0xf];
    base_blob<256u>::ToString_abi_cxx11_((string *)&local_98,&lock);
    logging_function._M_str = "ActiveTipChange";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    LogPrintFormatInternal<char[16],std::__cxx11::string,int>
              (logging_function,source_file,0xbc,VALIDATION,Debug,
               (ConstevalFormatString<3U>)0x826eb2,(char (*) [16])"ActiveTipChange",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
               &new_tip->nHeight);
    if (local_98.lock !=
        (UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_98.templock.super_unique_lock._M_owns) {
      operator_delete(local_98.lock,local_98.templock.super_unique_lock._8_8_ + 1);
    }
  }
  _Var3._M_head_impl =
       (this->m_internals)._M_t.
       super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
       _M_t.
       super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>.
       super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl;
  lock.super_unique_lock._8_8_ = lock.super_unique_lock._8_8_ & 0xffffffffffffff00;
  lock.super_unique_lock._M_device = (mutex_type *)_Var3._M_head_impl;
  std::unique_lock<std::mutex>::lock(&lock.super_unique_lock);
  __position._M_node =
       *(_List_node_base **)
        &((_Var3._M_head_impl)->m_list).
         super__List_base<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
  ;
  this_01 = (_List_node_base *)&(_Var3._M_head_impl)->m_list;
  if (__position._M_node != this_01) {
    do {
      *(int *)&__position._M_node[2]._M_next = *(int *)&__position._M_node[2]._M_next + 1;
      UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
                (&local_98,&lock,"lock",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
                 ,0x57);
      (*(code *)(__position._M_node[1]._M_next)->_M_next->_M_prev)
                (__position._M_node[1]._M_next,new_tip,is_ibd);
      UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(&local_98);
      p_Var1 = __position._M_node + 2;
      *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + -1;
      p_Var4 = (__position._M_node)->_M_next;
      if (*(int *)&p_Var1->_M_next == 0) {
        std::__cxx11::
        list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>::
        _M_erase((list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
                  *)this_01,__position);
      }
      __position._M_node = p_Var4;
    } while (p_Var4 != this_01);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::ActiveTipChange(const CBlockIndex& new_tip, bool is_ibd)
{
    LOG_EVENT("%s: new block hash=%s block height=%d", __func__, new_tip.GetBlockHash().ToString(), new_tip.nHeight);
    m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.ActiveTipChange(new_tip, is_ibd); });
}